

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::BufferViewTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,BufferViewTestInstance *this,deInt8 factor)

{
  VkDeviceSize size;
  int iVar1;
  int iVar2;
  DeviceInterface *vkd;
  VkDevice device;
  TextureLevel *pTVar3;
  Allocation *pAVar4;
  VkDeviceSize offset;
  IVec3 *size_00;
  void *data;
  int *piVar5;
  ostream *poVar6;
  Vector<int,_2> *this_00;
  VkBufferUsageFlags *this_01;
  allocator<char> local_2e9;
  string local_2e8;
  undefined4 local_2c4;
  string local_2c0;
  ostringstream local_2a0 [8];
  ostringstream errorMessage;
  deInt32 actual;
  deInt32 expected;
  IVec4 pixel;
  deInt32 i;
  undefined1 local_e0 [8];
  ConstPixelBufferAccess pixelBuffer;
  ConstPixelBufferAccess local_b0;
  PixelBufferAccess local_88;
  VkDeviceMemory local_60;
  DefaultDeleter<tcu::TextureLevel> local_55 [13];
  undefined1 local_48 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultLevel;
  TextureFormat tcuFormat;
  VkDevice vkDevice;
  DeviceInterface *vk;
  deInt8 factor_local;
  BufferViewTestInstance_conflict *this_local;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  resultLevel.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
  _8_8_ = ::vk::mapVkFormat(*(VkFormat *)((long)&(this->m_testCase).range + 4));
  pTVar3 = (TextureLevel *)operator_new(0x28);
  this_00 = (Vector<int,_2> *)((long)&(this->m_testCase).offset + 4);
  iVar1 = tcu::Vector<int,_2>::x(this_00);
  iVar2 = tcu::Vector<int,_2>::y(this_00);
  tcu::TextureLevel::TextureLevel
            (pTVar3,(TextureFormat *)
                    &resultLevel.
                     super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                     m_data.field_0x8,iVar1,iVar2,1);
  de::DefaultDeleter<tcu::TextureLevel>::DefaultDeleter(local_55);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_48,pTVar3);
  this_01 = &this[0xd].m_testCase.usage;
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this_01);
  local_60 = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this_01);
  offset = ::vk::Allocation::getOffset(pAVar4);
  size._0_4_ = (this->m_testCase).usage;
  size._4_4_ = (this->m_testCase).features;
  ::vk::invalidateMappedMemoryRange(vkd,device,local_60,offset,size);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator*((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                     local_48);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_88,pTVar3);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_48);
  pixelBuffer.m_data = (void *)tcu::TextureLevel::getFormat(pTVar3);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_48);
  size_00 = tcu::TextureLevel::getSize(pTVar3);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                      &this[0xd].m_testCase.usage);
  data = ::vk::Allocation::getHostPtr(pAVar4);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_b0,(TextureFormat *)&pixelBuffer.m_data,size_00,data);
  tcu::copy((EVP_PKEY_CTX *)&local_88,(EVP_PKEY_CTX *)&local_b0);
  pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
           operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_48);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)(pixel.m_data + 3),pTVar3);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_e0,(ConstPixelBufferAccess *)(pixel.m_data + 3));
  pixel.m_data[2] = 0;
  do {
    iVar1 = pixel.m_data[2];
    iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)((long)&(this->m_testCase).offset + 4));
    if (iVar2 <= iVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"BufferView test",&local_2e9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      local_2c4 = 1;
LAB_008241f2:
      de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
                ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_48);
      return __return_storage_ptr__;
    }
    tcu::ConstPixelBufferAccess::getPixelInt
              ((ConstPixelBufferAccess *)&actual,(int)local_e0,pixel.m_data[2],pixel.m_data[2]);
    iVar2 = (int)factor * ((int)(this->m_testCase).offset + pixel.m_data[2]);
    piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&actual,0);
    iVar1 = *piVar5;
    if (iVar2 != iVar1) {
      std::__cxx11::ostringstream::ostringstream(local_2a0);
      poVar6 = std::operator<<((ostream *)local_2a0,"BufferView test failed. expected: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      poVar6 = std::operator<<(poVar6," actual: ");
      std::ostream::operator<<(poVar6,iVar1);
      std::__cxx11::ostringstream::str();
      tcu::TestStatus::fail(__return_storage_ptr__,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      local_2c4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_2a0);
      goto LAB_008241f2;
    }
    pixel.m_data[2] = pixel.m_data[2] + 1;
  } while( true );
}

Assistant:

tcu::TestStatus BufferViewTestInstance::checkResult (deInt8 factor)
{
	const DeviceInterface&			vk					= m_context.getDeviceInterface();
	const VkDevice					vkDevice			= m_context.getDevice();
	const tcu::TextureFormat		tcuFormat			= mapVkFormat(m_colorFormat);
	de::MovePtr<tcu::TextureLevel>	resultLevel			(new tcu::TextureLevel(tcuFormat, m_renderSize.x(), m_renderSize.y()));

	invalidateMappedMemoryRange(vk, vkDevice, m_resultBufferAlloc->getMemory(), m_resultBufferAlloc->getOffset(), m_pixelDataSize);
	tcu::copy(*resultLevel, tcu::ConstPixelBufferAccess(resultLevel->getFormat(), resultLevel->getSize(), m_resultBufferAlloc->getHostPtr()));

	tcu::ConstPixelBufferAccess pixelBuffer = resultLevel->getAccess();
	for (deInt32 i = 0; i < (deInt32) m_renderSize.x(); ++i)
	{
		tcu::IVec4 pixel	= pixelBuffer.getPixelInt(i, i);
		deInt32 expected	= factor * (m_testCase.elementOffset + i);
		deInt32 actual		= pixel[0];
		if (expected != actual)
		{
			std::ostringstream errorMessage;
			errorMessage << "BufferView test failed. expected: " << expected << " actual: " << actual;
			return tcu::TestStatus::fail(errorMessage.str());
		}
	}

	return tcu::TestStatus::pass("BufferView test");
}